

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int gtTileSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  TIFF *pTVar2;
  ulong uVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  tmsize_t tVar7;
  char *module;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint32_t uVar14;
  uint32_t *puVar15;
  uint32_t uVar16;
  uint32_t *puVar17;
  byte bVar18;
  uchar *puVar19;
  ulong uVar20;
  bool bVar21;
  uint32_t local_f4;
  uint local_f0;
  uint32_t tw;
  uchar *buf;
  uint local_b8;
  uint32_t th;
  TIFF *local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  ulong local_90;
  uchar *local_88;
  uchar *local_80;
  TIFFRGBAImage *local_78;
  uint local_70;
  uint local_6c;
  tmsize_t local_68;
  long local_60;
  tmsize_t local_58;
  uchar *local_50;
  anon_union_8_3_994a2fbf_for_put local_48;
  uint32_t *local_40;
  ulong local_38;
  
  pTVar2 = img->tif;
  local_48 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  local_68 = TIFFTileSize(pTVar2);
  local_58 = _TIFFMultiplySSize(pTVar2,4 - (ulong)(iVar1 == 0),local_68,"gtTileSeparate");
  if (local_58 == 0) {
    return 0;
  }
  TIFFGetField(pTVar2,0x142,&tw);
  local_b0 = pTVar2;
  TIFFGetField(pTVar2,0x143,&th);
  local_b8 = setorientation(img);
  pTVar2 = local_b0;
  if ((local_b8 & 1) == 0) {
    if (w + 0x7fffffff < tw) {
LAB_002a9112:
      module = TIFFFileName(local_b0);
      TIFFErrorExtR(pTVar2,module,"%s","unsupported tile size (too wide)");
      return 0;
    }
    uVar6 = w - tw;
    local_f0 = 0;
  }
  else {
    if ((int)(tw + w) < 0) goto LAB_002a9112;
    local_f0 = h - 1;
    uVar6 = -(tw + w);
  }
  iVar9 = *(int *)&img->photometric;
  bVar21 = (ushort)iVar9 < 4;
  uVar8 = 3;
  if (bVar21) {
    uVar8 = (uint)(0x1000300010001 >> ((byte)(iVar9 << 4) & 0x3f));
  }
  uVar11 = (ulong)(uint)img->col_offset % (ulong)tw;
  if (h == 0) {
    iVar9 = 1;
  }
  else {
    iVar10 = (int)uVar11;
    bVar18 = bVar21 & 0xbU >> ((byte)iVar9 & 0xf);
    uVar14 = tw - iVar10;
    local_70 = iVar10 + uVar6;
    local_60 = local_68 * 3;
    local_6c = uVar8 & 0xffff;
    local_88 = (uchar *)0x0;
    local_a0 = (uchar *)0x0;
    local_a8 = (uchar *)0x0;
    local_98 = (uchar *)0x0;
    uVar13 = 0;
    local_78 = img;
    local_50 = (uchar *)(ulong)uVar6;
    do {
      iVar12 = (int)uVar13;
      iVar9 = th - (uint)(img->row_offset + iVar12) % th;
      iVar10 = h - iVar12;
      if ((uint)(iVar9 + iVar12) <= h) {
        iVar10 = iVar9;
      }
      bVar21 = true;
      local_90 = uVar13;
      if (w == 0) {
        iVar9 = 1;
      }
      else {
        local_f4 = img->col_offset;
        local_40 = raster + (ulong)local_f0 * (ulong)w;
        uVar20 = 0;
        puVar19 = (uchar *)(ulong)local_70;
        uVar13 = uVar11;
        uVar5 = uVar14;
        do {
          pTVar2 = local_b0;
          iVar9 = (int)local_90;
          uVar16 = img->row_offset + iVar9;
          local_80 = puVar19;
          local_38 = uVar20;
          if (buf == (uchar *)0x0) {
            tVar7 = _TIFFReadTileAndAllocBuffer(local_b0,&buf,local_58,local_f4,uVar16,0,0);
            if ((tVar7 != -1) || ((buf != (uchar *)0x0 && (img->stoponerr == 0)))) {
              local_88 = buf;
              if (bVar18 == 0) {
                local_a0 = buf + local_68;
                local_a8 = local_a0 + local_68;
                local_98 = (uchar *)0x0;
                if (iVar1 != 0) {
                  local_98 = local_a8 + local_68;
                }
              }
              else {
                local_98 = (uchar *)0x0;
                if (iVar1 != 0) {
                  local_98 = buf + local_60;
                }
                local_a8 = buf;
                local_a0 = buf;
              }
              goto LAB_002a8ecd;
            }
LAB_002a90c8:
            bVar21 = false;
            iVar9 = 0;
            goto LAB_002a90ed;
          }
          tVar7 = TIFFReadTile(local_b0,local_88,local_f4,uVar16,0,0);
          if ((tVar7 == -1) && (img->stoponerr != 0)) goto LAB_002a90c8;
LAB_002a8ecd:
          if (((bVar18 == 0) &&
              (((tVar7 = TIFFReadTile(pTVar2,local_a0,local_f4,img->row_offset + iVar9,0,1),
                tVar7 == -1 && (img->stoponerr != 0)) ||
               ((tVar7 = TIFFReadTile(pTVar2,local_a8,local_f4,img->row_offset + iVar9,0,2),
                tVar7 == -1 && (img->stoponerr != 0)))))) ||
             (((uVar20 = local_38, iVar1 != 0 &&
               (tVar7 = TIFFReadTile(pTVar2,local_98,local_f4,img->row_offset + iVar9,0,
                                     (uint16_t)local_6c), tVar7 == -1)) && (img->stoponerr != 0))))
          goto LAB_002a90c8;
          iVar12 = img->row_offset;
          uVar3 = (ulong)th;
          tVar7 = TIFFTileRowSize(pTVar2);
          puVar19 = local_50;
          iVar4 = (int)uVar20;
          uVar16 = uVar5;
          if (w < iVar4 + uVar5) {
            uVar16 = w - iVar4;
          }
          local_80 = local_88 +
                     (ulong)local_78->samplesperpixel * (long)(int)uVar13 +
                     tVar7 * ((ulong)(uint)(iVar12 + iVar9) % uVar3);
          (*local_48.any)(local_78);
          uVar20 = (ulong)(iVar4 + uVar16);
          local_f4 = local_f4 + uVar16;
          uVar13 = 0;
          img = local_78;
          uVar5 = tw;
        } while (iVar4 + uVar16 < w);
        iVar9 = 1;
        bVar21 = true;
      }
LAB_002a90ed:
      iVar12 = -iVar10;
      if ((local_b8 & 1) == 0) {
        iVar12 = iVar10;
      }
      if (!bVar21) break;
      local_f0 = local_f0 + iVar12;
      uVar13 = (ulong)(uint)(iVar10 + (int)local_90);
    } while ((uint)(iVar10 + (int)local_90) < h);
  }
  if (h != 0 && 1 < local_b8) {
    uVar11 = 0;
    uVar13 = 0;
    do {
      puVar15 = raster + (int)uVar13 * w + ((ulong)w - 1);
      if (raster + (int)uVar13 * w < puVar15) {
        puVar17 = raster + uVar11 + 1;
        do {
          uVar14 = puVar17[-1];
          puVar17[-1] = *puVar15;
          *puVar15 = uVar14;
          puVar15 = puVar15 + -1;
          bVar21 = puVar17 < puVar15;
          puVar17 = puVar17 + 1;
        } while (bVar21);
      }
      uVar13 = uVar13 + 1;
      uVar11 = (ulong)((int)uVar11 + w);
    } while (uVar13 != h);
  }
  _TIFFfreeExt(img->tif,buf);
  return iVar9;
}

Assistant:

static int gtTileSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                          uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    uint32_t col, row, y, rowstoread;
    tmsize_t pos;
    uint32_t tw, th;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL;
    unsigned char *p1 = NULL;
    unsigned char *p2 = NULL;
    unsigned char *pa = NULL;
    tmsize_t tilesize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    uint32_t nrow;
    int ret = 1, flip;
    uint16_t colorchannels;
    uint32_t this_tw, tocol;
    int32_t this_toskew, leftmost_toskew;
    int32_t leftmost_fromskew;
    uint32_t leftmost_tw;

    tilesize = TIFFTileSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, tilesize, "gtTileSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tw);
    TIFFGetField(tif, TIFFTAG_TILELENGTH, &th);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if ((tw + w) > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(tw + w);
    }
    else
    {
        if (tw > (INT_MAX + w))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = 0;
        toskew = -(int32_t)(tw - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    /*
     *	Leftmost tile is clipped on left side if col_offset > 0.
     */
    leftmost_fromskew = img->col_offset % tw;
    leftmost_tw = tw - leftmost_fromskew;
    leftmost_toskew = toskew + leftmost_fromskew;
    for (row = 0; ret != 0 && row < h; row += nrow)
    {
        rowstoread = th - (row + img->row_offset) % th;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        fromskew = leftmost_fromskew;
        this_tw = leftmost_tw;
        this_toskew = leftmost_toskew;
        tocol = 0;
        col = img->col_offset;
        while (tocol < w)
        {
            if (buf == NULL)
            {
                if (_TIFFReadTileAndAllocBuffer(tif, (void **)&buf, bufsize,
                                                col, row + img->row_offset, 0,
                                                0) == (tmsize_t)(-1) &&
                    (buf == NULL || img->stoponerr))
                {
                    ret = 0;
                    break;
                }
                p0 = buf;
                if (colorchannels == 1)
                {
                    p2 = p1 = p0;
                    pa = (alpha ? (p0 + 3 * tilesize) : NULL);
                }
                else
                {
                    p1 = p0 + tilesize;
                    p2 = p1 + tilesize;
                    pa = (alpha ? (p2 + tilesize) : NULL);
                }
            }
            else if (TIFFReadTile(tif, p0, col, row + img->row_offset, 0, 0) ==
                         (tmsize_t)(-1) &&
                     img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p1, col, row + img->row_offset, 0, 1) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p2, col, row + img->row_offset, 0, 2) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (alpha &&
                TIFFReadTile(tif, pa, col, row + img->row_offset, 0,
                             colorchannels) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }

            pos = ((row + img->row_offset) % th) * TIFFTileRowSize(tif) +
                  ((tmsize_t)fromskew * img->samplesperpixel);
            if (tocol + this_tw > w)
            {
                /*
                 * Rightmost tile is clipped on right side.
                 */
                fromskew = tw - (w - tocol);
                this_tw = tw - fromskew;
                this_toskew = toskew + fromskew;
            }
            tmsize_t roffset = (tmsize_t)y * w + tocol;
            (*put)(img, raster + roffset, tocol, y, this_tw, nrow, fromskew,
                   this_toskew, p0 + pos, p1 + pos, p2 + pos,
                   (alpha ? (pa + pos) : NULL));
            tocol += this_tw;
            col += this_tw;
            /*
             * After the leftmost tile, tiles are no longer clipped on left
             * side.
             */
            fromskew = 0;
            this_tw = tw;
            this_toskew = toskew;
        }

        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}